

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_yplus_dist(REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_DBL rho,REF_DBL t,REF_DBL y,
                   REF_DBL u,REF_DBL *yplus_dist)

{
  uint uVar1;
  double dVar2;
  REF_DBL u_tau;
  double local_18;
  
  *yplus_dist = -1.0;
  if (reference_t_k <= 0.0) {
    dVar2 = 1.0;
  }
  else {
    if (t < 0.0) {
      dVar2 = sqrt(t);
    }
    else {
      dVar2 = SQRT(t);
    }
    dVar2 = ((110.56 / reference_t_k + 1.0) / (110.56 / reference_t_k + t)) * t * dVar2;
  }
  dVar2 = ((dVar2 / rho) * mach) / re;
  uVar1 = ref_phys_u_tau(y,u,dVar2,&local_18);
  if (uVar1 == 0) {
    *yplus_dist = dVar2 / local_18;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2b4,
           "ref_phys_yplus_dist",(ulong)uVar1,"u_tau");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_dist(REF_DBL mach, REF_DBL re,
                                       REF_DBL reference_t_k, REF_DBL rho,
                                       REF_DBL t, REF_DBL y, REF_DBL u,
                                       REF_DBL *yplus_dist) {
  REF_DBL mu, nu_mach_re, u_tau;
  *yplus_dist = -1.0;
  RSS(viscosity_law(t, reference_t_k, &mu), "sutherlands");
  nu_mach_re = mu / rho * mach / re;
  RSS(ref_phys_u_tau(y, u, nu_mach_re, &u_tau), "u_tau");
  *yplus_dist = nu_mach_re / u_tau;
  return REF_SUCCESS;
}